

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_get_tlsext_status_type(SSL *ssl)

{
  bool bVar1;
  pointer pSVar2;
  pointer pSVar3;
  byte local_22;
  byte local_21;
  SSL_HANDSHAKE *hs;
  SSL *ssl_local;
  
  if ((ssl->field_0xa4 & 1) == 0) {
    bVar1 = std::operator!=(&ssl->config,(nullptr_t)0x0);
    local_22 = 0;
    if (bVar1) {
      pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      local_22 = (byte)(*(ushort *)&pSVar3->field_0x10d >> 2) & 1;
    }
    ssl_local._4_4_ = -1;
    if (local_22 != 0) {
      ssl_local._4_4_ = 1;
    }
  }
  else {
    pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get(&ssl->s3->hs);
    local_21 = 0;
    if (pSVar2 != (pointer)0x0) {
      local_21 = (byte)(*(uint *)&pSVar2->field_0x6c8 >> 7) & 1;
    }
    ssl_local._4_4_ = -1;
    if (local_21 != 0) {
      ssl_local._4_4_ = 1;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_get_tlsext_status_type(const SSL *ssl) {
  if (ssl->server) {
    SSL_HANDSHAKE *hs = ssl->s3->hs.get();
    return hs != nullptr && hs->ocsp_stapling_requested
               ? TLSEXT_STATUSTYPE_ocsp
               : TLSEXT_STATUSTYPE_nothing;
  }

  return ssl->config != nullptr && ssl->config->ocsp_stapling_enabled
             ? TLSEXT_STATUSTYPE_ocsp
             : TLSEXT_STATUSTYPE_nothing;
}